

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_> *
__thiscall
slang::ast::Compilation::getPackages
          (vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
           *__return_storage_ptr__,Compilation *this)

{
  const_iterator cVar1;
  PackageSymbol *pPVar2;
  bool bVar3;
  ulong uVar4;
  const_iterator __position;
  table_element_pointer __t;
  ulong uVar5;
  const_iterator __begin2;
  less local_59;
  vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  *local_58;
  iterator local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
             ::begin(&(this->packageMap).table_);
  __t = local_50.p_;
  local_58 = __return_storage_ptr__;
  while (__t != (table_element_pointer)0x0) {
    cVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(__return_storage_ptr__->
                  super__Vector_base<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)cVar1._M_current >> 3;
    while (__position._M_current = cVar1._M_current, __return_storage_ptr__ = local_58,
          0 < (long)uVar4) {
      uVar5 = uVar4 >> 1;
      pPVar2 = (__position._M_current + uVar5 + 1)[-1];
      local_40._M_len = (pPVar2->super_Symbol).name._M_len;
      local_40._M_str = (pPVar2->super_Symbol).name._M_str;
      bVar3 = std::ranges::less::
              operator()<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        (&local_59,&__t->first,&local_40);
      uVar4 = ~uVar5 + uVar4;
      cVar1._M_current = __position._M_current + uVar5 + 1;
      if (bVar3) {
        uVar4 = uVar5;
        cVar1._M_current = __position._M_current;
      }
    }
    std::
    vector<const_slang::ast::PackageSymbol_*,_std::allocator<const_slang::ast::PackageSymbol_*>_>::
    insert(local_58,__position,(value_type *)&__t->second);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)&local_50);
    __t = local_50.p_;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const PackageSymbol*> Compilation::getPackages() const {
    std::vector<const PackageSymbol*> result;
    for (auto& [name, pkg] : packageMap) {
        result.insert(
            std::ranges::upper_bound(result, name, {}, [](auto item) { return item->name; }), pkg);
    }
    return result;
}